

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O2

void __thiscall
cmConfigureLog::WriteValue
          (cmConfigureLog *this,string_view key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list)

{
  pointer pbVar1;
  StreamWriter *pSVar2;
  ofstream *poVar3;
  pointer value;
  Value VStack_58;
  
  BeginObject(this,key);
  pbVar1 = (list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (value = (list->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
    poVar3 = BeginLine(this);
    std::operator<<(&poVar3->super_basic_ostream<char,_std::char_traits<char>_>,"- ");
    pSVar2 = (this->Encoder)._M_t.
             super___uniq_ptr_impl<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Json::StreamWriter_*,_std::default_delete<Json::StreamWriter>_>.
             super__Head_base<0UL,_Json::StreamWriter_*,_false>._M_head_impl;
    Json::Value::Value(&VStack_58,value);
    (*pSVar2->_vptr_StreamWriter[2])(pSVar2,&VStack_58,&this->Stream);
    Json::Value::~Value(&VStack_58);
    std::endl<char,std::char_traits<char>>
              (&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>);
  }
  EndObject(this);
  return;
}

Assistant:

void cmConfigureLog::WriteValue(cm::string_view key,
                                std::vector<std::string> const& list)
{
  this->BeginObject(key);
  for (auto const& value : list) {
    this->BeginLine() << "- ";
    this->Encoder->write(value, &this->Stream);
    this->EndLine();
  }
  this->EndObject();
}